

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.h
# Opt level: O2

void __thiscall
chrono::ChLinkLockParallel::ChLinkLockParallel(ChLinkLockParallel *this,ChLinkLockParallel *param_1)

{
  ChLinkLock::ChLinkLock(&this->super_ChLinkLock,&param_1->super_ChLinkLock);
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkLock_01164938;
  return;
}

Assistant:

class ChApi ChLinkLockParallel : public ChLinkLock {
  public:
    ChLinkLockParallel() { ChangeLinkType(LinkType::PARALLEL); }

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLinkLockParallel* Clone() const override { return new ChLinkLockParallel(*this); }

    /// Lock the joint.
    /// If enabled (lock = true) this effectively converts this joint into a weld joint.
    /// If lock = false, the joint reverts to its original degrees of freedom.
    void Lock(bool lock);
}